

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RadialTangentialDistortion::invTransform
          (RadialTangentialDistortion *this,double *xd,double *yd,double xx,double yy)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  double dtmp [16];
  long ltmp [2];
  double fvec [2];
  RadialTangentialDistortionParameter param;
  double x [2];
  undefined1 local_118 [128];
  undefined1 local_98 [40];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_70 = *(undefined8 *)(in_RDI + 0x10);
  local_68 = *(undefined8 *)(in_RDI + 0x18);
  local_60 = *(undefined8 *)(in_RDI + 0x20);
  local_58 = *(undefined8 *)(in_RDI + 0x28);
  local_50 = *(undefined8 *)(in_RDI + 0x30);
  local_38 = in_XMM0_Qa;
  local_30 = in_XMM1_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(local_98,0,0x10);
  memset(local_118,0,0x80);
  slmder((lmderFct)dtmp[10],dtmp[9]._4_4_,dtmp[9]._0_4_,(double *)dtmp[8],(double *)dtmp[7],
         (void *)dtmp[6],dtmp[5],(long *)fvec[0],(double *)fvec[1]);
  *local_10 = local_38;
  *local_18 = local_30;
  return;
}

Assistant:

void RadialTangentialDistortion::invTransform(double &xd, double &yd, double xx, double yy) const
{
  double x[2]= {xx, yy};

  RadialTangentialDistortionParameter param;

  param.kd[0]=kd[0];
  param.kd[1]=kd[1];
  param.kd[2]=kd[2];
  param.kd[3]=kd[3];
  param.kd[4]=kd[4];

  param.xd=xx;
  param.yd=yy;

  double fvec[2];

  long ltmp[2]= {0, 0};
  double dtmp[16];

  memset(dtmp, 0, 16*sizeof(double));
  gmath::slmder(computeRadialTangentialDistortion, 2, 2, x, fvec, &param, 1e-6, ltmp, dtmp);

  xd=x[0];
  yd=x[1];
}